

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::CopyListToTree(InnerMap *this,size_type b,Tree *tree)

{
  Node *pNVar1;
  size_type this_00;
  Node *next;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  Node *local_30;
  Node *node;
  size_type count;
  Tree *tree_local;
  size_type b_local;
  InnerMap *this_local;
  
  node = (Node *)0x0;
  local_30 = (Node *)this->table_[b];
  count = (size_type)tree;
  tree_local = (Tree *)b;
  b_local = (size_type)this;
  while (this_00 = count, local_30 != (Node *)0x0) {
    local_38 = KeyPtrFromNodePtr(local_30);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)this_00,&local_38);
    node = (Node *)&(node->kv).k_.field_0x1;
    pNVar1 = local_30->next;
    local_30->next = (Node *)0x0;
    local_30 = pNVar1;
  }
  return (size_type)node;
}

Assistant:

size_type CopyListToTree(size_type b, Tree* tree) {
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      while (node != NULL) {
        tree->insert(KeyPtrFromNodePtr(node));
        ++count;
        Node* next = node->next;
        node->next = NULL;
        node = next;
      }
      return count;
    }